

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniball.hpp
# Opt level: O0

void __thiscall
Miniball::
Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
::pivot_mb(Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
           *this,Pit n)

{
  float fVar1;
  bool bVar2;
  iterator __first;
  float fVar3;
  _Self local_68;
  int local_5c;
  float **ppfStack_58;
  int j;
  float *local_50;
  Cit p;
  NT local_40;
  NT sqr_r;
  NT max_e;
  NT e;
  Pit k;
  Pit pivot;
  NT *c;
  NT old_sqr_r;
  Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
  *this_local;
  Pit n_local;
  
  this_local = (Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
                *)n._M_current;
  __gnu_cxx::
  __normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
  ::__normal_iterator(&k);
  __gnu_cxx::
  __normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
  ::__normal_iterator((__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
                       *)&max_e);
  do {
    fVar1 = this->current_sqr_r;
    p._4_4_ = this->current_sqr_r;
    k._M_current = (this->points_begin)._M_current;
    local_40 = this->nt0;
    _max_e = (this->points_begin)._M_current;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
                               *)&max_e,
                              (__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
                               *)&this_local), bVar2) {
      ppfStack_58 = _max_e;
      local_50 = CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>
                 ::operator()((CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>
                               *)&this->field_0x18,(Pit)_max_e);
      sqr_r = -p._4_4_;
      pivot._M_current = (float **)this->current_c;
      for (local_5c = 0; local_5c < this->d; local_5c = local_5c + 1) {
        fVar3 = *local_50;
        local_50 = local_50 + 1;
        fVar3 = mb_sqr<float>(fVar3 - *(float *)pivot._M_current);
        sqr_r = fVar3 + sqr_r;
        pivot._M_current = pivot._M_current + 4;
      }
      if (local_40 < sqr_r) {
        local_40 = sqr_r;
        k._M_current = _max_e;
      }
      __gnu_cxx::
      __normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
      ::operator++((__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>
                    *)&max_e);
    }
    if (this->nt0 <= local_40 && local_40 != this->nt0) {
      __first = std::__cxx11::
                list<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>_>_>
                ::begin(&this->L);
      local_68._M_node =
           (_List_node_base *)
           std::
           find<std::_List_iterator<__gnu_cxx::__normal_iterator<float_const*const*,std::vector<float_const*,std::allocator<float_const*>>>>,__gnu_cxx::__normal_iterator<float_const*const*,std::vector<float_const*,std::allocator<float_const*>>>>
                     (__first._M_node,(this->support_end)._M_node,&k);
      bVar2 = std::operator==(&local_68,&this->support_end);
      if (bVar2) {
        if (this->fsize != 0) {
          __assert_fail("fsize == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/kmeans/../miniball/miniball.hpp"
                        ,0x18a,
                        "void Miniball::Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>>::pivot_mb(Pit) [CoordAccessor = Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>]"
                       );
        }
        bVar2 = push(this,k);
        if (bVar2) {
          mtf_mb(this,(this->support_end)._M_node);
          pop(this);
          pivot_move_to_front(this,k);
        }
      }
    }
  } while (fVar1 < this->current_sqr_r);
  return;
}

Assistant:

void Miniball<CoordAccessor>::pivot_mb (Pit n)
    {
        // Algorithm 2: pivot_mb (L_{n-1}), where L_{n-1} = [L.begin, n)
        // --------------------------------------------------------------
        // from B. Gaertner, Fast and Robust Smallest Enclosing Balls, ESA 1999,
        // http://www.inf.ethz.ch/personal/gaertner/texts/own_work/esa99_final.pdf
        NT          old_sqr_r;
        const NT*   c;
        Pit         pivot, k;
        NT          e, max_e, sqr_r;
        Cit p;
        do {
            old_sqr_r = current_sqr_r;
            sqr_r = current_sqr_r;

            pivot = points_begin;
            max_e = nt0;
            for (k = points_begin; k != n; ++k) {
                p = coord_accessor(k);
                e = -sqr_r;
                c = current_c;
                for (int j=0; j<d; ++j)
                    e += mb_sqr<NT>(*p++-*c++);
                if (e > max_e) {
                    max_e = e;
                    pivot = k;
                }
            }

            if (max_e > nt0) {
                // check if the pivot is already contained in the support set
                if (std::find(L.begin(), support_end, pivot) == support_end) {
                    assert (fsize == 0);
                    if (push (pivot)) {
                        mtf_mb(support_end);
                        pop();
                        pivot_move_to_front(pivot);
                    }
                }
            }
        } while (old_sqr_r < current_sqr_r);
    }